

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void Assimp::FBX::ResolveVertexDataArray<aiVector3t<float>>
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *data_out,
               Scope *source,string *MappingInformationType,string *ReferenceInformationType,
               char *dataElementName,char *indexDataElementName,size_t vertex_count,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_counts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_offsets,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mappings)

{
  uint uVar1;
  uint uVar2;
  pointer paVar3;
  pointer paVar4;
  pointer paVar5;
  float fVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  Element *pEVar11;
  long lVar12;
  pointer piVar13;
  ulong uVar14;
  uint uVar15;
  _Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this;
  ulong uVar16;
  allocator local_22a;
  allocator local_229;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempData;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempData_1;
  vector<int,_std::allocator<int>_> uvIndices;
  format local_1a8;
  
  bVar7 = std::operator==(ReferenceInformationType,"Direct");
  bVar8 = std::operator==(ReferenceInformationType,"IndexToDirect");
  if (bVar8) {
    std::__cxx11::string::string((string *)&local_1a8,indexDataElementName,(allocator *)&tempData);
    bVar9 = HasElement(source,(string *)&local_1a8);
    bVar9 = !bVar9;
    std::__cxx11::string::~string((string *)&local_1a8);
    bVar8 = bVar9;
  }
  else {
    bVar8 = true;
    bVar9 = false;
  }
  bVar10 = std::operator==(MappingInformationType,"ByVertice");
  if (((bVar7 | bVar9) == 1) && (bVar10)) {
    std::__cxx11::string::string((string *)&local_1a8,dataElementName,(allocator *)&tempData);
    bVar7 = HasElement(source,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if (!bVar7) {
      return;
    }
    tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_1a8,dataElementName,(allocator *)&tempData_1);
    pEVar11 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
    ParseVectorDataArray(&tempData,pEVar11);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              (data_out,vertex_count);
    for (lVar12 = 0;
        lVar12 != ((long)tempData.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)tempData.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0xc; lVar12 = lVar12 + 1) {
      uVar15 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start[lVar12];
      uVar1 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start[lVar12];
      for (uVar14 = (ulong)uVar15; uVar14 < uVar1 + uVar15; uVar14 = uVar14 + 1) {
        uVar2 = (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar14];
        paVar3 = (data_out->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        paVar3[uVar2].z =
             tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar12].z;
        fVar6 = tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar12].y;
        paVar3 = paVar3 + uVar2;
        paVar3->x = tempData.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar12].x;
        paVar3->y = fVar6;
      }
    }
LAB_0050531d:
    this = &tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>;
  }
  else {
    bVar10 = std::operator==(MappingInformationType,"ByVertice");
    if (bVar10 && !bVar8) {
      tempData_1.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tempData_1.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      tempData_1.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_1a8,dataElementName,(allocator *)&tempData);
      pEVar11 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
      ParseVectorDataArray(&tempData_1,pEVar11);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                (data_out,vertex_count);
      uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_1a8,indexDataElementName,(allocator *)&tempData)
      ;
      pEVar11 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
      ParseVectorDataArray(&uvIndices,pEVar11);
      std::__cxx11::string::~string((string *)&local_1a8);
      for (lVar12 = 0;
          lVar12 != (long)uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2; lVar12 = lVar12 + 1) {
        uVar15 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar12];
        uVar1 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar12];
        for (uVar14 = (ulong)uVar15; uVar14 < uVar1 + uVar15; uVar14 = uVar14 + 1) {
          uVar16 = (ulong)uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar12];
          if ((ulong)(((long)tempData_1.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)tempData_1.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= uVar16) {
            std::__cxx11::string::string((string *)&local_1a8,"index out of range",&local_229);
            std::__cxx11::string::string((string *)&tempData,indexDataElementName,&local_22a);
            pEVar11 = GetRequiredElement(source,(string *)&tempData,(Element *)0x0);
            Util::DOMError((string *)&local_1a8,pEVar11);
          }
          uVar2 = (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar14];
          paVar3 = (data_out->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          paVar3[uVar2].z =
               tempData_1.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].z;
          fVar6 = tempData_1.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar16].y;
          paVar3 = paVar3 + uVar2;
          paVar3->x = tempData_1.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar16].x;
          paVar3->y = fVar6;
        }
      }
    }
    else {
      bVar10 = std::operator==(MappingInformationType,"ByPolygonVertex");
      if (((bVar7 | bVar9) & bVar10) == 1) {
        tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&local_1a8,dataElementName,(allocator *)&tempData_1);
        pEVar11 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
        ParseVectorDataArray(&tempData,pEVar11);
        std::__cxx11::string::~string((string *)&local_1a8);
        if (((long)tempData.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)tempData.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start) / 0xc == vertex_count) {
          paVar3 = (data_out->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          (data_out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          paVar4 = (data_out->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          paVar5 = (data_out->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          (data_out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start =
               tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (data_out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish =
               tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start = paVar4;
          tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = paVar5;
          tempData.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = paVar3;
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    (&local_1a8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::operator<<((ostream *)&local_1a8,", expected ");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          LogFunctions<Assimp::FBXImporter>::LogError(&local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        }
        goto LAB_0050531d;
      }
      bVar7 = std::operator==(MappingInformationType,"ByPolygonVertex");
      if (bVar8 || !bVar7) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[60]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_1a8,
                   (char (*) [60])"ignoring vertex data channel, access type not implemented: ");
        std::operator<<((ostream *)&local_1a8,(string *)MappingInformationType);
        std::operator<<((ostream *)&local_1a8,",");
        std::operator<<((ostream *)&local_1a8,(string *)ReferenceInformationType);
        LogFunctions<Assimp::FBXImporter>::LogError(&local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        return;
      }
      tempData_1.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tempData_1.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      tempData_1.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_1a8,dataElementName,(allocator *)&tempData);
      pEVar11 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
      ParseVectorDataArray(&tempData_1,pEVar11);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                (data_out,vertex_count);
      uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_1a8,indexDataElementName,(allocator *)&tempData)
      ;
      pEVar11 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
      ParseVectorDataArray(&uvIndices,pEVar11);
      std::__cxx11::string::~string((string *)&local_1a8);
      if ((long)uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == vertex_count) {
        uVar15 = 0;
        for (piVar13 = uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            piVar13 !=
            uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish; piVar13 = piVar13 + 1) {
          uVar14 = (ulong)*piVar13;
          if (uVar14 == 0xffffffffffffffff) {
            paVar4 = (data_out->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar3 = paVar4 + uVar15;
            paVar3->x = 0.0;
            paVar3->y = 0.0;
            paVar4[uVar15].z = 0.0;
          }
          else {
            if ((ulong)(((long)tempData_1.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)tempData_1.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= uVar14) {
              std::__cxx11::string::string((string *)&local_1a8,"index out of range",&local_229);
              std::__cxx11::string::string((string *)&tempData,indexDataElementName,&local_22a);
              pEVar11 = GetRequiredElement(source,(string *)&tempData,(Element *)0x0);
              Util::DOMError((string *)&local_1a8,pEVar11);
            }
            paVar3 = (data_out->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar3[uVar15].z =
                 tempData_1.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar14].z;
            fVar6 = tempData_1.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14].y;
            paVar3 = paVar3 + uVar15;
            paVar3->x = tempData_1.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar14].x;
            paVar3->y = fVar6;
          }
          uVar15 = uVar15 + 1;
        }
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x505330);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&uvIndices.super__Vector_base<int,_std::allocator<int>_>);
    this = &tempData_1.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>;
  }
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base(this);
  return;
}

Assistant:

void ResolveVertexDataArray(std::vector<T>& data_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType,
    const char* dataElementName,
    const char* indexDataElementName,
    size_t vertex_count,
    const std::vector<unsigned int>& mapping_counts,
    const std::vector<unsigned int>& mapping_offsets,
    const std::vector<unsigned int>& mappings)
{
    bool isDirect = ReferenceInformationType == "Direct";
    bool isIndexToDirect = ReferenceInformationType == "IndexToDirect";

    // fall-back to direct data if there is no index data element
    if ( isIndexToDirect && !HasElement( source, indexDataElementName ) ) {
        isDirect = true;
        isIndexToDirect = false;
    }

    // handle permutations of Mapping and Reference type - it would be nice to
    // deal with this more elegantly and with less redundancy, but right
    // now it seems unavoidable.
    if (MappingInformationType == "ByVertice" && isDirect) {
        if (!HasElement(source, dataElementName)) {
            return;
        }
        std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);
		for (size_t i = 0, e = tempData.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				data_out[mappings[j]] = tempData[i];
            }
        }
    }
    else if (MappingInformationType == "ByVertice" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));
        for (size_t i = 0, e = uvIndices.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				if (static_cast<size_t>(uvIndices[i]) >= tempData.size()) {
                    DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
                }
				data_out[mappings[j]] = tempData[uvIndices[i]];
            }
        }
    }
    else if (MappingInformationType == "ByPolygonVertex" && isDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

		if (tempData.size() != vertex_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
				<< tempData.size() << ", expected " << vertex_count
            );
            return;
        }

		data_out.swap(tempData);
    }
    else if (MappingInformationType == "ByPolygonVertex" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));

        if (uvIndices.size() != vertex_count) {
            FBXImporter::LogError("length of input data unexpected for ByPolygonVertex mapping");
            return;
        }

        const T empty;
        unsigned int next = 0;
        for(int i : uvIndices) {
            if ( -1 == i ) {
                data_out[ next++ ] = empty;
                continue;
            }
            if (static_cast<size_t>(i) >= tempData.size()) {
                DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
            }

			data_out[next++] = tempData[i];
        }
    }
    else {
        FBXImporter::LogError(Formatter::format("ignoring vertex data channel, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}